

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O0

int __thiscall Fl_Slider::handle(Fl_Slider *this,int event,int X,int Y,int W,int H)

{
  bool bVar1;
  uchar uVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int local_cc;
  int local_c8;
  int local_c4;
  Fl_Widget_Tracker local_88;
  Fl_Widget_Tracker wp_1;
  double dStack_78;
  char tryAgain;
  double v;
  int xx;
  int xx_2;
  int T;
  int xx_1;
  int S;
  int mx;
  int ww;
  double val;
  Fl_Widget_Tracker local_38;
  Fl_Widget_Tracker wp;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  int event_local;
  Fl_Slider *this_local;
  
  wp.wp_._4_4_ = H;
  switch(event) {
  case 1:
    Fl_Widget_Tracker::Fl_Widget_Tracker(&local_38,(Fl_Widget *)this);
    iVar3 = Fl::event_inside(X,Y,W,wp.wp_._4_4_);
    if (iVar3 == 0) {
      this_local._4_4_ = 0;
      bVar1 = true;
    }
    else {
      Fl_Valuator::handle_push(&this->super_Fl_Valuator);
      iVar3 = Fl_Widget_Tracker::deleted(&local_38);
      if (iVar3 == 0) {
        bVar1 = false;
      }
      else {
        this_local._4_4_ = 1;
        bVar1 = true;
      }
    }
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_38);
    if (bVar1) {
      return this_local._4_4_;
    }
  case 5:
    dVar4 = Fl_Valuator::minimum(&this->super_Fl_Valuator);
    dVar5 = Fl_Valuator::maximum(&this->super_Fl_Valuator);
    if ((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) {
      dVar4 = Fl_Valuator::value(&this->super_Fl_Valuator);
      dVar5 = Fl_Valuator::minimum(&this->super_Fl_Valuator);
      dVar7 = Fl_Valuator::maximum(&this->super_Fl_Valuator);
      dVar6 = Fl_Valuator::minimum(&this->super_Fl_Valuator);
      _mx = (dVar4 - dVar5) / (dVar7 - dVar6);
      if (_mx <= 1.0) {
        if (_mx < 0.0) {
          _mx = 0.0;
        }
      }
      else {
        _mx = 1.0;
      }
    }
    else {
      _mx = 0.5;
    }
    iVar3 = Fl_Valuator::horizontal(&this->super_Fl_Valuator);
    local_c4 = W;
    if (iVar3 == 0) {
      local_c4 = wp.wp_._4_4_;
    }
    iVar3 = Fl_Valuator::horizontal(&this->super_Fl_Valuator);
    if (iVar3 == 0) {
      local_c8 = Fl::event_y();
      local_c8 = local_c8 - Y;
    }
    else {
      local_c8 = Fl::event_x();
      local_c8 = local_c8 - X;
    }
    uVar2 = Fl_Widget::type((Fl_Widget *)this);
    if ((uVar2 == '\x03') || (uVar2 = Fl_Widget::type((Fl_Widget *)this), uVar2 == '\x02')) {
      T = 0;
      if (event == 1) {
        handle::offcenter = local_c8 - (int)(_mx * (double)local_c4 + 0.5);
        if ((-0xb < handle::offcenter) && (handle::offcenter < 0xb)) {
          return 1;
        }
        handle::offcenter = 0;
      }
    }
    else {
      T = (int)(*(float *)&(this->super_Fl_Valuator).field_0xa4 * (float)local_c4 + 0.5);
      if (local_c4 <= T) {
        return 0;
      }
      iVar3 = Fl_Valuator::horizontal(&this->super_Fl_Valuator);
      local_cc = W;
      if (iVar3 != 0) {
        local_cc = wp.wp_._4_4_;
      }
      xx = local_cc / 2 + 1;
      uVar2 = Fl_Widget::type((Fl_Widget *)this);
      if ((uVar2 == '\x04') || (uVar2 = Fl_Widget::type((Fl_Widget *)this), uVar2 == '\x05')) {
        xx = local_cc / 2 + 5;
      }
      if (T < xx) {
        T = xx;
      }
      if (event == 1) {
        handle::offcenter = local_c8 - (int)(_mx * (double)(local_c4 - T) + 0.5);
        if (handle::offcenter < 0) {
          handle::offcenter = 0;
        }
        else {
          if (handle::offcenter <= T) {
            return 1;
          }
          handle::offcenter = T;
        }
      }
    }
    v._4_4_ = local_c8 - handle::offcenter;
    dStack_78 = 0.0;
    wp_1.wp_._7_1_ = '\x01';
    Y_local = event;
    while (wp_1.wp_._7_1_ != '\0') {
      wp_1.wp_._7_1_ = '\0';
      if (v._4_4_ < 0) {
        v._4_4_ = 0;
        handle::offcenter = local_c8;
        if (local_c8 < 0) {
          handle::offcenter = 0;
        }
      }
      else if (local_c4 - T < v._4_4_) {
        v._4_4_ = local_c4 - T;
        handle::offcenter = local_c8 - v._4_4_;
        if (T < handle::offcenter) {
          handle::offcenter = T;
        }
      }
      dVar4 = Fl_Valuator::maximum(&this->super_Fl_Valuator);
      dVar5 = Fl_Valuator::minimum(&this->super_Fl_Valuator);
      dVar7 = Fl_Valuator::minimum(&this->super_Fl_Valuator);
      dStack_78 = Fl_Valuator::round(&this->super_Fl_Valuator,
                                     ((double)v._4_4_ * (dVar4 - dVar5)) / (double)(local_c4 - T) +
                                     dVar7);
      if (Y_local == 1) {
        dVar4 = Fl_Valuator::value(&this->super_Fl_Valuator);
        if ((dStack_78 == dVar4) && (!NAN(dStack_78) && !NAN(dVar4))) {
          handle::offcenter = T / 2;
          Y_local = 5;
          wp_1.wp_._7_1_ = '\x01';
        }
      }
    }
    dVar4 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dStack_78);
    Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar4);
    this_local._4_4_ = 1;
    break;
  case 2:
    Fl_Valuator::handle_release(&this->super_Fl_Valuator);
    this_local._4_4_ = 1;
    break;
  case 3:
  case 4:
    this_local._4_4_ = 1;
    break;
  case 6:
  case 7:
    iVar3 = Fl::visible_focus();
    if (iVar3 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      Fl_Widget::redraw((Fl_Widget *)this);
      this_local._4_4_ = 1;
    }
    break;
  case 8:
    Fl_Widget_Tracker::Fl_Widget_Tracker(&local_88,(Fl_Widget *)this);
    iVar3 = Fl::event_key();
    switch(iVar3) {
    case 0xff51:
      iVar3 = Fl_Valuator::horizontal(&this->super_Fl_Valuator);
      if (iVar3 == 0) {
        this_local._4_4_ = 0;
      }
      else {
        Fl_Valuator::handle_push(&this->super_Fl_Valuator);
        iVar3 = Fl_Widget_Tracker::deleted(&local_88);
        if (iVar3 == 0) {
          dVar4 = Fl_Valuator::value(&this->super_Fl_Valuator);
          dVar4 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar4,-1);
          dVar4 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar4);
          Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar4);
          iVar3 = Fl_Widget_Tracker::deleted(&local_88);
          if (iVar3 == 0) {
            Fl_Valuator::handle_release(&this->super_Fl_Valuator);
            this_local._4_4_ = 1;
          }
          else {
            this_local._4_4_ = 1;
          }
        }
        else {
          this_local._4_4_ = 1;
        }
      }
      break;
    case 0xff52:
      iVar3 = Fl_Valuator::horizontal(&this->super_Fl_Valuator);
      if (iVar3 == 0) {
        Fl_Valuator::handle_push(&this->super_Fl_Valuator);
        iVar3 = Fl_Widget_Tracker::deleted(&local_88);
        if (iVar3 == 0) {
          dVar4 = Fl_Valuator::value(&this->super_Fl_Valuator);
          dVar4 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar4,-1);
          dVar4 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar4);
          Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar4);
          iVar3 = Fl_Widget_Tracker::deleted(&local_88);
          if (iVar3 == 0) {
            Fl_Valuator::handle_release(&this->super_Fl_Valuator);
            this_local._4_4_ = 1;
          }
          else {
            this_local._4_4_ = 1;
          }
        }
        else {
          this_local._4_4_ = 1;
        }
      }
      else {
        this_local._4_4_ = 0;
      }
      break;
    case 0xff53:
      iVar3 = Fl_Valuator::horizontal(&this->super_Fl_Valuator);
      if (iVar3 == 0) {
        this_local._4_4_ = 0;
      }
      else {
        Fl_Valuator::handle_push(&this->super_Fl_Valuator);
        iVar3 = Fl_Widget_Tracker::deleted(&local_88);
        if (iVar3 == 0) {
          dVar4 = Fl_Valuator::value(&this->super_Fl_Valuator);
          dVar4 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar4,1);
          dVar4 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar4);
          Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar4);
          iVar3 = Fl_Widget_Tracker::deleted(&local_88);
          if (iVar3 == 0) {
            Fl_Valuator::handle_release(&this->super_Fl_Valuator);
            this_local._4_4_ = 1;
          }
          else {
            this_local._4_4_ = 1;
          }
        }
        else {
          this_local._4_4_ = 1;
        }
      }
      break;
    case 0xff54:
      iVar3 = Fl_Valuator::horizontal(&this->super_Fl_Valuator);
      if (iVar3 == 0) {
        Fl_Valuator::handle_push(&this->super_Fl_Valuator);
        iVar3 = Fl_Widget_Tracker::deleted(&local_88);
        if (iVar3 == 0) {
          dVar4 = Fl_Valuator::value(&this->super_Fl_Valuator);
          dVar4 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar4,1);
          dVar4 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar4);
          Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar4);
          iVar3 = Fl_Widget_Tracker::deleted(&local_88);
          if (iVar3 == 0) {
            Fl_Valuator::handle_release(&this->super_Fl_Valuator);
            this_local._4_4_ = 1;
          }
          else {
            this_local._4_4_ = 1;
          }
        }
        else {
          this_local._4_4_ = 1;
        }
      }
      else {
        this_local._4_4_ = 0;
      }
      break;
    default:
      this_local._4_4_ = 0;
    }
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_88);
    break;
  default:
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Slider::handle(int event, int X, int Y, int W, int H) {
  // Fl_Widget_Tracker wp(this);
  switch (event) {
  case FL_PUSH: {
    Fl_Widget_Tracker wp(this);
    if (!Fl::event_inside(X, Y, W, H)) return 0;
    handle_push();
    if (wp.deleted()) return 1; }
    // fall through ...
  case FL_DRAG: {

    double val;
    if (minimum() == maximum())
      val = 0.5;
    else {
      val = (value()-minimum())/(maximum()-minimum());
      if (val > 1.0) val = 1.0;
      else if (val < 0.0) val = 0.0;
    }

    int ww = (horizontal() ? W : H);
    int mx = (horizontal() ? Fl::event_x()-X : Fl::event_y()-Y);
    int S;
    static int offcenter;

    if (type() == FL_HOR_FILL_SLIDER || type() == FL_VERT_FILL_SLIDER) {

      S = 0;
      if (event == FL_PUSH) {
	int xx = int(val*ww+.5);
	offcenter = mx-xx;
	if (offcenter < -10 || offcenter > 10) offcenter = 0;
	else return 1;
      }

    } else {

      S = int(slider_size_*ww+.5); if (S >= ww) return 0;
      int T = (horizontal() ? H : W)/2+1;
      if (type()==FL_VERT_NICE_SLIDER || type()==FL_HOR_NICE_SLIDER) T += 4;
      if (S < T) S = T;
      if (event == FL_PUSH) {
	int xx = int(val*(ww-S)+.5);
	offcenter = mx-xx;
	if (offcenter < 0) offcenter = 0;
	else if (offcenter > S) offcenter = S;
	else return 1;
      }
    }

    int xx = mx-offcenter;
    double v = 0;
    char tryAgain = 1;
    while (tryAgain)
    {
      tryAgain = 0;
      if (xx < 0) {
        xx = 0;
        offcenter = mx; if (offcenter < 0) offcenter = 0;
      } else if (xx > (ww-S)) {
        xx = ww-S;
        offcenter = mx-xx; if (offcenter > S) offcenter = S;
      }
      v = round(xx*(maximum()-minimum())/(ww-S) + minimum());
      // make sure a click outside the sliderbar moves it:
      if (event == FL_PUSH && v == value()) {
        offcenter = S/2;
        event = FL_DRAG;
        tryAgain = 1;
      }
    }
    handle_drag(clamp(v));
    } return 1;
  case FL_RELEASE:
    handle_release();
    return 1;
  case FL_KEYBOARD:
    { Fl_Widget_Tracker wp(this);
      switch (Fl::event_key()) {
	case FL_Up:
	  if (horizontal()) return 0;
	  handle_push();
	  if (wp.deleted()) return 1;
	  handle_drag(clamp(increment(value(),-1)));
	  if (wp.deleted()) return 1;
	  handle_release();
	  return 1;
	case FL_Down:
	  if (horizontal()) return 0;
	  handle_push();
	  if (wp.deleted()) return 1;
	  handle_drag(clamp(increment(value(),1)));
	  if (wp.deleted()) return 1;
	  handle_release();
	  return 1;
	case FL_Left:
	  if (!horizontal()) return 0;
	  handle_push();
	  if (wp.deleted()) return 1;
	  handle_drag(clamp(increment(value(),-1)));
	  if (wp.deleted()) return 1;
	  handle_release();
	  return 1;
	case FL_Right:
	  if (!horizontal()) return 0;
	  handle_push();
	  if (wp.deleted()) return 1;
	  handle_drag(clamp(increment(value(),1)));
	  if (wp.deleted()) return 1;
	  handle_release();
	  return 1;
	default:
	  return 0;
      }
    }
    // break not required because of switch...
  case FL_FOCUS :
  case FL_UNFOCUS :
    if (Fl::visible_focus()) {
      redraw();
      return 1;
    } else return 0;
  case FL_ENTER :
  case FL_LEAVE :
    return 1;
  default:
    return 0;
  }
}